

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text)

{
  pointer pCVar1;
  cmake *this_00;
  bool bVar2;
  cmListFileContext lfc;
  cmOutputConverter converter;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long local_78;
  string local_70;
  cmOutputConverter local_50;
  
  pCVar1 = (this->CallStack).
           super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start == pCVar1) {
    local_b8._0_8_ = local_b8 + 0x10;
    local_b8._8_8_ = (pointer)0x0;
    local_b8[0x10] = '\0';
    local_98._8_8_ = 0;
    local_88._M_local_buf[0] = '\0';
    local_78 = 0;
    local_98._M_allocated_capacity = (size_type)&local_88;
    std::__cxx11::string::_M_assign((string *)local_98._M_local_buf);
    bVar2 = cmake::GetIsInTryCompile(this->LocalGenerator->GlobalGenerator->CMakeInstance);
    if (!bVar2) {
      cmOutputConverter::cmOutputConverter(&local_50,this->StateSnapshot);
      cmOutputConverter::Convert(&local_70,&local_50,(string *)&local_98,HOME,UNCHANGED);
      std::__cxx11::string::operator=((string *)local_98._M_local_buf,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    local_78 = 0;
    cmake::IssueMessage(this->LocalGenerator->GlobalGenerator->CMakeInstance,t,text,
                        (cmListFileContext *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity,
                      CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
    }
    if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
    }
  }
  else {
    if (t - FATAL_ERROR < 2) {
      (pCVar1[-1].Status)->NestedError = true;
    }
    this_00 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
    GetBacktrace((cmListFileBacktrace *)local_b8,this);
    cmake::IssueMessage(this_00,t,text,(cmListFileBacktrace *)local_b8);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_b8);
  }
  return;
}

Assistant:

void cmMakefile::IssueMessage(cmake::MessageType t,
                              std::string const& text) const
{
  // Collect context information.
  if(!this->CallStack.empty())
    {
    if((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR))
      {
      this->CallStack.back().Status->SetNestedError(true);
      }
    this->GetCMakeInstance()->IssueMessage(t, text, this->GetBacktrace());
    }
  else
    {
    cmListFileContext lfc;
    // We are not currently executing a command.  Add whatever context
    // information we have.
    lfc.FilePath = this->ListFileStack.back();

    if(!this->GetCMakeInstance()->GetIsInTryCompile())
      {
      cmOutputConverter converter(this->StateSnapshot);
      lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
      }
    lfc.Line = 0;
    this->GetCMakeInstance()->IssueMessage(t, text, lfc);
    }
}